

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabor.h
# Opt level: O2

void __thiscall gimage::GaborKernel::set(GaborKernel *this,float s,float l,float t,float g,float p)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long i;
  long lVar4;
  long lVar5;
  long i_1;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  float local_78;
  float fStack_74;
  
  if (s <= 0.5) {
    s = 0.5;
  }
  lVar9 = (long)(int)((int)(s * 5.0 + 0.5) | 1);
  Image<float,_gimage::PixelTraits<float>_>::setSize(&this->re,lVar9,lVar9,1);
  Image<float,_gimage::PixelTraits<float>_>::setSize(&this->im,lVar9,lVar9,1);
  uVar1 = (this->re).width;
  uVar2 = (this->re).height;
  pfVar10 = **(this->re).img;
  pfVar11 = **(this->im).img;
  lVar5 = (long)(int)(uVar1 >> 1);
  uVar3 = uVar2 >> 1;
  local_78 = 0.0;
  fStack_74 = 0.0;
  for (lVar9 = 0; lVar9 < (long)uVar2; lVar9 = lVar9 + 1) {
    dVar14 = (double)(lVar9 - (int)uVar3);
    lVar7 = 0;
    lVar8 = lVar5;
    for (lVar4 = 0; lVar4 < (long)uVar1; lVar4 = lVar4 + 1) {
      fVar12 = sinf(t);
      fVar13 = cosf(t);
      dVar17 = (double)(lVar4 - lVar5) * (double)fVar13 + dVar14 * (double)fVar12;
      dVar15 = (double)lVar8 * (double)fVar12 + (double)fVar13 * dVar14;
      dVar15 = exp(-(dVar17 * dVar17 + dVar15 * (double)(g * g) * dVar15) / (double)((s + s) * s));
      dVar17 = (dVar17 * 6.283185307179586) / (double)l + (double)p;
      dVar16 = cos(dVar17);
      pfVar10[lVar4] = (float)(dVar16 * dVar15);
      dVar17 = sin(dVar17);
      pfVar11[lVar4] = (float)(dVar17 * dVar15);
      local_78 = local_78 + ABS((float)(dVar17 * dVar15));
      fStack_74 = fStack_74 + ABS(pfVar10[lVar4]);
      uVar1 = (this->re).width;
      lVar8 = lVar8 + -1;
      lVar7 = lVar7 + -4;
    }
    uVar2 = (this->re).height;
    pfVar11 = (float *)((long)pfVar11 - lVar7);
    pfVar10 = (float *)((long)pfVar10 - lVar7);
  }
  pfVar10 = **(this->re).img;
  pfVar11 = **(this->im).img;
  uVar3 = 0;
  if ((long)uVar1 < 1) {
    uVar1 = uVar3;
  }
  if ((long)uVar2 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    lVar9 = 0;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      pfVar10[uVar6] = pfVar10[uVar6] / fStack_74;
      pfVar11[uVar6] = pfVar11[uVar6] / local_78;
      lVar9 = lVar9 + -4;
    }
    pfVar11 = (float *)((long)pfVar11 - lVar9);
    pfVar10 = (float *)((long)pfVar10 - lVar9);
  }
  return;
}

Assistant:

void set(float s, float l, float t, float g=1, float p=0)
    {
      s=std::max(0.5f, s);

      int kn=static_cast<int>(5*s+0.5f);

      if ((kn&1) == 0)
      {
        kn++;
      }

      re.setSize(kn, kn, 1);
      im.setSize(kn, kn, 1);

      int w2=re.getWidth()>>1;
      int h2=re.getHeight()>>1;

      // compute kernels for real and imaginary part

      float re_sum=0;
      float im_sum=0;

      float *rep=re.getPtr(0, 0, 0);
      float *imp=im.getPtr(0, 0, 0);

      for (long k=0; k<re.getHeight(); k++)
      {
        for (long i=0; i<re.getWidth(); i++)
        {
          double st=std::sin(t);
          double ct=std::cos(t);

          double a=(i-w2)*ct+(k-h2)*st;
          double b=-(i-w2)*st+(k-h2)*ct;

          double gs=std::exp(-(a*a+g*g*b*b)/(2*s*s));

          a=2*gmath::pi*a/l+p;

          *rep=static_cast<float>(gs*std::cos(a));
          *imp=static_cast<float>(gs*std::sin(a));

          re_sum+=std::abs(*rep++);
          im_sum+=std::abs(*imp++);
        }
      }

      // normalization of kernal to absolute sum of 1

      rep=re.getPtr(0, 0, 0);
      imp=im.getPtr(0, 0, 0);

      for (long k=0; k<re.getHeight(); k++)
      {
        for (long i=0; i<re.getWidth(); i++)
        {
          *rep++/=re_sum;
          *imp++/=im_sum;
        }
      }
    }